

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  u32 uVar2;
  Pgno PVar3;
  MemPage *pMVar4;
  u8 *puVar5;
  ulong uVar6;
  DbPage *pDbPage_00;
  int iVar7;
  Pgno *pPVar8;
  undefined4 in_register_00000014;
  uint uVar9;
  long lVar10;
  BtShared *pBVar11;
  uint uVar12;
  int nByte;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  Pgno nextPage;
  int local_60;
  uint local_5c;
  BtShared *local_58;
  ulong local_50;
  int local_44;
  uchar *local_40;
  DbPage *pDbPage;
  ulong uVar13;
  
  pMVar4 = pCur->pPage;
  if (pMVar4->nCell <= pCur->ix) {
    iVar7 = 0x11886;
LAB_0012edb7:
    iVar7 = sqlite3CorruptError(iVar7);
    return iVar7;
  }
  pBVar11 = pCur->pBt;
  local_50 = CONCAT44(in_register_00000014,amt);
  getCellInfo(pCur);
  puVar5 = (pCur->info).pPayload;
  uVar1 = (pCur->info).nLocal;
  uVar12 = (uint)uVar1;
  local_58 = pBVar11;
  if ((ulong)(pBVar11->usableSize - uVar12) < (ulong)((long)puVar5 - (long)pMVar4->aData)) {
    iVar7 = 0x11895;
    goto LAB_0012edb7;
  }
  local_60 = eOp;
  if (uVar12 < offset || uVar12 - offset == 0) {
    uVar15 = (ulong)(offset - uVar1);
    iVar7 = 0;
    uVar13 = local_50;
  }
  else {
    iVar16 = (int)local_50;
    nByte = uVar12 - offset;
    if (iVar16 + offset <= (uint)uVar1) {
      nByte = iVar16;
    }
    iVar7 = copyPayload(puVar5 + offset,pBuf,nByte,eOp,pMVar4->pDbPage);
    pBuf = pBuf + nByte;
    uVar15 = 0;
    uVar13 = (ulong)(uint)(iVar16 - nByte);
  }
  if ((iVar7 != 0) || ((int)uVar13 == 0)) goto LAB_0012f024;
  uVar2 = local_58->usableSize;
  uVar12 = uVar2 - 4;
  uVar1 = (pCur->info).nLocal;
  local_40 = pBuf;
  nextPage = sqlite3Get4byte(puVar5 + uVar1);
  local_5c = uVar12;
  if ((pCur->curFlags & 4) == 0) {
    pPVar8 = (Pgno *)0x0;
    uVar12 = (((pCur->info).nPayload + (uVar2 - uVar1)) - 5) / uVar12;
    if (pCur->aOverflow == (Pgno *)0x0) {
LAB_0012eea8:
      pPVar8 = (Pgno *)sqlite3Realloc(pPVar8,(long)(int)(uVar12 * 2) << 2);
      if (pPVar8 == (Pgno *)0x0) {
        return 7;
      }
      pCur->aOverflow = pPVar8;
    }
    else {
      iVar7 = (*sqlite3Config.m.xSize)(pCur->aOverflow);
      pPVar8 = pCur->aOverflow;
      if (iVar7 < (int)(uVar12 * 4)) goto LAB_0012eea8;
    }
    lVar10 = 0;
    memset(pPVar8,0,(long)(int)uVar12 << 2);
    pCur->curFlags = pCur->curFlags | 4;
  }
  else {
    uVar6 = uVar15 / uVar12;
    lVar10 = 0;
    if (pCur->aOverflow[uVar6] != 0) {
      lVar10 = (long)(int)uVar6;
      nextPage = pCur->aOverflow[lVar10];
      uVar15 = uVar15 % (ulong)uVar12;
    }
  }
  local_44 = (uint)(local_60 == 0) * 2;
  pBVar11 = local_58;
  lVar10 = lVar10 * 4;
  uVar12 = local_5c;
  do {
    if (nextPage == 0) {
      iVar7 = 0;
      break;
    }
    if (pBVar11->nPage < nextPage) {
      iVar7 = 0x118d3;
      goto LAB_0012f039;
    }
    pPVar8 = pCur->aOverflow;
    *(Pgno *)((long)pPVar8 + lVar10) = nextPage;
    uVar14 = (uint)uVar15;
    uVar9 = uVar14 - uVar12;
    if (uVar14 < uVar12) {
      iVar16 = uVar12 - uVar14;
      if ((int)uVar13 + uVar14 <= uVar12) {
        iVar16 = (int)uVar13;
      }
      local_50 = uVar13;
      iVar7 = (*pBVar11->pPager->xGet)(pBVar11->pPager,nextPage,&pDbPage,local_44);
      pDbPage_00 = pDbPage;
      uVar9 = uVar14;
      if (iVar7 == 0) {
        puVar5 = (u8 *)pDbPage->pData;
        nextPage = sqlite3Get4byte(puVar5);
        iVar7 = copyPayload(puVar5 + (uVar14 + 4),local_40,iVar16,local_60,pDbPage_00);
        sqlite3PagerUnref(pDbPage);
        uVar9 = 0;
      }
      uVar12 = (int)local_50 - iVar16;
      uVar13 = (ulong)uVar12;
      if (uVar12 == 0) {
        return iVar7;
      }
      local_40 = local_40 + iVar16;
      pBVar11 = local_58;
      uVar12 = local_5c;
    }
    else {
      PVar3 = *(Pgno *)((long)pPVar8 + lVar10 + 4);
      if (PVar3 == 0) {
        iVar7 = getOverflowPage(pBVar11,nextPage,(MemPage **)0x0,&nextPage);
        pBVar11 = local_58;
        uVar12 = local_5c;
      }
      else {
        iVar7 = 0;
        nextPage = PVar3;
      }
    }
    uVar15 = (ulong)uVar9;
    lVar10 = lVar10 + 4;
  } while (iVar7 == 0);
LAB_0012f024:
  if ((iVar7 == 0) && ((int)uVar13 != 0)) {
    iVar7 = 0x11928;
LAB_0012f039:
    iVar7 = sqlite3CorruptError(iVar7);
  }
  return iVar7;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->pPage;               /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;     /* Start of original out buffer */
#endif

  assert( pPage );
  assert( eOp==0 || eOp==1 );
  assert( pCur->eState==CURSOR_VALID );
  if( pCur->ix>=pPage->nCell ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
  assert( offset+amt <= pCur->info.nPayload );

  assert( aPayload > pPage->aData );
  if( (uptr)(aPayload - pPage->aData) > (pBt->usableSize - pCur->info.nLocal) ){
    /* Trying to read or write past the end of the data is an error.  The
    ** conditional above is really:
    **    &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
    ** but is recast into its current form to avoid integer overflow problems
    */
    return SQLITE_CORRUPT_PAGE(pPage);
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( pCur->aOverflow==0
       || nOvfl*(int)sizeof(Pgno) > sqlite3MallocSize(pCur->aOverflow)
      ){
        Pgno *aNew = (Pgno*)sqlite3Realloc(
            pCur->aOverflow, nOvfl*2*sizeof(Pgno)
        );
        if( aNew==0 ){
          return SQLITE_NOMEM_BKPT;
        }else{
          pCur->aOverflow = aNew;
        }
      }
      memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
      pCur->curFlags |= BTCF_ValidOvfl;
    }else{
      /* If the overflow page-list cache has been allocated and the
      ** entry for the first required overflow page is valid, skip
      ** directly to it.
      */
      if( pCur->aOverflow[offset/ovflSize] ){
        iIdx = (offset/ovflSize);
        nextPage = pCur->aOverflow[iIdx];
        offset = (offset%ovflSize);
      }
    }

    assert( rc==SQLITE_OK && amt>0 );
    while( nextPage ){
      /* If required, populate the overflow page-list cache. */
      if( nextPage > pBt->nPage ) return SQLITE_CORRUPT_BKPT;
      assert( pCur->aOverflow[iIdx]==0
              || pCur->aOverflow[iIdx]==nextPage
              || CORRUPT_DB );
      pCur->aOverflow[iIdx] = nextPage;

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and
        **   2) data is required from the start of this overflow page, and
        **   3) there are no dirty pages in the page-cache
        **   4) the database is file-backed, and
        **   5) the page is not in the WAL file
        **   6) at least 4 bytes have already been read into the output buffer
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && sqlite3PagerDirectReadOk(pBt->pPager, nextPage)    /* (3,4,5) */
         && &pBuf[-4]>=pBufStart                               /* (6) */
        ){
          sqlite3_file *fd = sqlite3PagerFile(pBt->pPager);
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* due to (6) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          if( rc && nextPage>pBt->nPage ) rc = SQLITE_CORRUPT_BKPT;
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerGet(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        if( amt==0 ) return rc;
        pBuf += a;
      }
      if( rc ) break;
      iIdx++;
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    /* Overflow chain ends prematurely */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  return rc;
}